

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoFast.c
# Opt level: O2

Vec_Int_t * Iso_StoCollectInfo(Iso_Sto_t *p,Aig_Obj_t *pPo)

{
  ushort uVar1;
  Aig_Man_t *p_00;
  Iso_Dat_t *pIVar2;
  Vec_Ptr_t *p_01;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  int *__ptr;
  Vec_Int_t *pVVar7;
  int iVar8;
  Aig_Obj_t *pObj;
  ulong uVar9;
  
  if ((*(uint *)&pPo->field_0x18 & 7) != 3) {
    __assert_fail("Aig_ObjIsCo(pPo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoFast.c"
                  ,0xba,"Vec_Int_t *Iso_StoCollectInfo(Iso_Sto_t *, Aig_Obj_t *)");
  }
  p_00 = p->pAig;
  pIVar2 = p->pData;
  p->vVisited->nSize = 0;
  p_01 = p->vRoots;
  p_01->nSize = 0;
  Vec_PtrPush(p_01,pPo);
  for (iVar8 = 0; iVar8 < p->vRoots->nSize; iVar8 = iVar8 + 1) {
    pvVar6 = Vec_PtrEntry(p->vRoots,iVar8);
    pObj = (Aig_Obj_t *)(*(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe);
    if ((*(uint *)&pObj->field_0x18 & 7) != 1) {
      Iso_StoCollectInfo_rec
                (p_00,pObj,(uint)*(ulong *)((long)pvVar6 + 8) & 1,p->vVisited,p->pData,p->vRoots);
    }
  }
  p->vPlaces->nSize = 0;
  for (iVar8 = 0; pVVar7 = p->vVisited, iVar8 < pVVar7->nSize; iVar8 = iVar8 + 1) {
    iVar3 = Vec_IntEntry(pVVar7,iVar8);
    uVar1 = *(ushort *)(pIVar2 + iVar3);
    iVar4 = p->pCounters[uVar1];
    p->pCounters[uVar1] = iVar4 + 1;
    if (iVar4 == 0) {
      Vec_IntPush(p->vPlaces,(uint)uVar1);
    }
    p->pData[iVar3] = (Iso_Dat_t)0x0;
  }
  pVVar7->nSize = 0;
  iVar8 = 0;
  while( true ) {
    if (p->vPlaces->nSize <= iVar8) {
      __ptr = Abc_MergeSortCost(p->vVisited->pArray,p->vVisited->nSize);
      iVar8 = Vec_IntEntry(p->vVisited,*__ptr);
      iVar4 = Vec_IntEntry(p->vVisited,__ptr[(long)p->vVisited->nSize + -1]);
      if (iVar8 <= iVar4) {
        pVVar7 = Vec_IntAlloc(p->vVisited->nSize);
        for (uVar9 = (ulong)(uint)p->vVisited->nSize; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
          iVar8 = Vec_IntEntry(p->vVisited,__ptr[uVar9 - 1]);
          uVar5 = Vec_IntEntry(p->vPlaces,__ptr[uVar9 - 1]);
          Vec_IntPush(pVVar7,iVar8 << 0x10 | uVar5);
        }
        free(__ptr);
        return pVVar7;
      }
      __assert_fail("Vec_IntEntry(p->vVisited, pPerm[0]) <= Vec_IntEntry(p->vVisited, pPerm[Vec_IntSize(p->vVisited)-1])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoFast.c"
                    ,0xdf,"Vec_Int_t *Iso_StoCollectInfo(Iso_Sto_t *, Aig_Obj_t *)");
    }
    iVar4 = Vec_IntEntry(p->vPlaces,iVar8);
    if (p->pCounters[iVar4] == 0) break;
    Vec_IntPush(p->vVisited,p->pCounters[iVar4]);
    p->pCounters[iVar4] = 0;
    iVar8 = iVar8 + 1;
  }
  __assert_fail("p->pCounters[Entry]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoFast.c"
                ,0xd7,"Vec_Int_t *Iso_StoCollectInfo(Iso_Sto_t *, Aig_Obj_t *)");
}

Assistant:

Vec_Int_t * Iso_StoCollectInfo( Iso_Sto_t * p, Aig_Obj_t * pPo )
{
    int fVerboseShow = 0;
    Vec_Int_t * vInfo;
    Iso_Dat2_t * pData2 = (Iso_Dat2_t *)p->pData;
    Aig_Man_t * pAig = p->pAig;
    Aig_Obj_t * pObj;
    int i, Value, Entry, * pPerm;
//    abctime clk = Abc_Clock();

    assert( Aig_ObjIsCo(pPo) );

    // collect initial POs
    Vec_IntClear( p->vVisited );
    Vec_PtrClear( p->vRoots );
    Vec_PtrPush( p->vRoots, pPo );

    // mark internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vRoots, pObj, i )
        if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            Iso_StoCollectInfo_rec( pAig, Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj), p->vVisited, p->pData, p->vRoots );
//    time_Trav += Abc_Clock() - clk;

    // count how many times each data entry appears
    Vec_IntClear( p->vPlaces );
    Vec_IntForEachEntry( p->vVisited, Entry, i )
    {
        Value = pData2[Entry].Data;
//        assert( Value > 0 );
        if ( p->pCounters[Value]++ == 0 )
            Vec_IntPush( p->vPlaces, Value );
//        pData2[Entry].Data = 0;
        *((int *)(p->pData + Entry)) = 0;
    }

    // collect non-trivial counters
    Vec_IntClear( p->vVisited );
    Vec_IntForEachEntry( p->vPlaces, Entry, i )
    {
        assert( p->pCounters[Entry] );
        Vec_IntPush( p->vVisited, p->pCounters[Entry] );
        p->pCounters[Entry] = 0;
    }
//    printf( "%d ", Vec_IntSize(p->vVisited) );

    // sort the costs in the increasing order
    pPerm = Abc_MergeSortCost( Vec_IntArray(p->vVisited), Vec_IntSize(p->vVisited) );
    assert( Vec_IntEntry(p->vVisited, pPerm[0]) <= Vec_IntEntry(p->vVisited, pPerm[Vec_IntSize(p->vVisited)-1]) );

    // create information
    vInfo = Vec_IntAlloc( Vec_IntSize(p->vVisited) );
    for ( i = Vec_IntSize(p->vVisited)-1; i >= 0; i-- )
    {
        Entry = Vec_IntEntry( p->vVisited, pPerm[i] );
        Entry = (Entry << AIG_ISO_NUM) | Vec_IntEntry( p->vPlaces, pPerm[i] );
        Vec_IntPush( vInfo, Entry );
    }
    ABC_FREE( pPerm );

    // show the final result
    if ( fVerboseShow )
    Vec_IntForEachEntry( vInfo, Entry, i )
    {
        Iso_Dat2_t Data = { Entry & 0xFFFF };
        Iso_Dat_t * pData = (Iso_Dat_t *)&Data;

        printf( "%6d : ", i );
        printf( "Freq =%6d ", Entry >> 16 );

        printf( "FiNeg =%3d ", pData->nFiNeg );
        printf( "FoNeg =%3d ", pData->nFoNeg );
        printf( "FoPos =%3d ", pData->nFoPos );
        printf( "Fi0L  =%3d ", pData->Fi0Lev );
        printf( "Fi1L  =%3d ", pData->Fi1Lev );
        printf( "Lev   =%3d ", pData->Level  );
        printf( "\n" );
    }
    return vInfo;
}